

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_pipeline_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  uint _h;
  _func_int *p_Var1;
  ulong uVar2;
  int _w;
  Mat weight_data_r2;
  
  p_Var1 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  _w = *(int *)(&this->field_0xd8 + (long)p_Var1) * *(int *)(&this->field_0xd4 + (long)p_Var1);
  _h = *(uint *)(&this->field_0x108 + (long)p_Var1);
  uVar2 = (long)*(int *)(&this->field_0x104 + (long)p_Var1) / (long)(int)_h;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / (long)_w;
  if ((_h == *(uint *)(&this->field_0xd0 + (long)p_Var1)) &&
     ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var1) / (int)_h)) * _h == _h)) {
    if (((_h & 7) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&weight_data_r2,(Mat *)(&this->field_0x168 + (long)p_Var1),_w,_h,(Allocator *)0x0
                  );
      convert_packing(&weight_data_r2,&this->weight_data_int8,8,opt);
      Mat::~Mat(&weight_data_r2);
    }
  }
  else {
    create_group_ops(this,opt);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_int8, 8, opt);
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}